

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void NV12ToARGBRow_SSSE3(uint8_t *y_buf,uint8_t *uv_buf,uint8_t *dst_argb,YuvConstants *yuvconstants
                        ,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  char cVar7;
  char cVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  ushort uVar56;
  undefined1 auVar57 [14];
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  undefined1 auVar60 [14];
  undefined1 auVar61 [12];
  unkbyte10 Var62;
  undefined3 uVar63;
  unkbyte9 Var64;
  unkbyte9 Var65;
  uint uVar66;
  undefined1 auVar67 [11];
  undefined5 uVar68;
  unkbyte9 Var69;
  uint6 uVar70;
  undefined1 auVar71 [13];
  unkbyte9 Var72;
  undefined1 auVar73 [15];
  undefined6 uVar74;
  undefined4 uVar75;
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_argb_local;
  uint8_t *uv_buf_local;
  uint8_t *y_buf_local;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined2 uVar84;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 uVar105;
  
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar32 = yuvconstants->kUVBiasB[0];
  sVar33 = yuvconstants->kUVBiasB[1];
  sVar34 = yuvconstants->kUVBiasB[2];
  sVar35 = yuvconstants->kUVBiasB[3];
  sVar36 = yuvconstants->kUVBiasB[4];
  sVar37 = yuvconstants->kUVBiasB[5];
  sVar38 = yuvconstants->kUVBiasB[6];
  sVar39 = yuvconstants->kUVBiasB[7];
  sVar40 = yuvconstants->kUVBiasG[0];
  sVar41 = yuvconstants->kUVBiasG[1];
  sVar42 = yuvconstants->kUVBiasG[2];
  sVar43 = yuvconstants->kUVBiasG[3];
  sVar44 = yuvconstants->kUVBiasG[4];
  sVar45 = yuvconstants->kUVBiasG[5];
  sVar46 = yuvconstants->kUVBiasG[6];
  sVar47 = yuvconstants->kUVBiasG[7];
  sVar48 = yuvconstants->kUVBiasR[0];
  sVar49 = yuvconstants->kUVBiasR[1];
  sVar50 = yuvconstants->kUVBiasR[2];
  sVar51 = yuvconstants->kUVBiasR[3];
  sVar52 = yuvconstants->kUVBiasR[4];
  sVar53 = yuvconstants->kUVBiasR[5];
  sVar54 = yuvconstants->kUVBiasR[6];
  sVar55 = yuvconstants->kUVBiasR[7];
  auVar5 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  do {
    uVar1 = *(ulong *)uv_buf;
    uv_buf = (uint8_t *)((long)uv_buf + 8);
    uVar84 = (undefined2)(uVar1 >> 0x30);
    auVar77._8_4_ = 0;
    auVar77._0_8_ = uVar1;
    auVar77._12_2_ = uVar84;
    auVar77._14_2_ = uVar84;
    uVar84 = (undefined2)(uVar1 >> 0x20);
    auVar104._12_4_ = auVar77._12_4_;
    auVar104._8_2_ = 0;
    auVar104._0_8_ = uVar1;
    auVar104._10_2_ = uVar84;
    auVar85._10_6_ = auVar104._10_6_;
    auVar85._8_2_ = uVar84;
    auVar85._0_8_ = uVar1;
    uVar84 = (undefined2)(uVar1 >> 0x10);
    auVar95._8_8_ = auVar85._8_8_;
    auVar95._6_2_ = uVar84;
    auVar95._4_2_ = uVar84;
    auVar95._0_2_ = (undefined2)uVar1;
    auVar95._2_2_ = auVar95._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar105 = (undefined1)(uVar1 >> 0x38);
    auVar103._8_6_ = 0;
    auVar103._0_8_ = uVar1;
    auVar103[0xe] = uVar105;
    auVar103[0xf] = uVar105;
    uVar105 = (undefined1)(uVar1 >> 0x30);
    auVar102._14_2_ = auVar103._14_2_;
    auVar102._8_5_ = 0;
    auVar102._0_8_ = uVar1;
    auVar102[0xd] = uVar105;
    auVar101._13_3_ = auVar102._13_3_;
    auVar101._8_4_ = 0;
    auVar101._0_8_ = uVar1;
    auVar101[0xc] = uVar105;
    uVar105 = (undefined1)(uVar1 >> 0x28);
    auVar100._12_4_ = auVar101._12_4_;
    auVar100._8_3_ = 0;
    auVar100._0_8_ = uVar1;
    auVar100[0xb] = uVar105;
    auVar99._11_5_ = auVar100._11_5_;
    auVar99._8_2_ = 0;
    auVar99._0_8_ = uVar1;
    auVar99[10] = uVar105;
    uVar105 = (undefined1)(uVar1 >> 0x20);
    auVar98._10_6_ = auVar99._10_6_;
    auVar98[8] = 0;
    auVar98._0_8_ = uVar1;
    auVar98[9] = uVar105;
    auVar97._9_7_ = auVar98._9_7_;
    auVar97[8] = uVar105;
    auVar97._0_8_ = uVar1;
    uVar105 = (undefined1)(uVar1 >> 0x18);
    auVar96._8_8_ = auVar97._8_8_;
    auVar96[7] = uVar105;
    auVar96[6] = uVar105;
    uVar105 = (undefined1)(uVar1 >> 0x10);
    auVar96[5] = uVar105;
    auVar96[4] = uVar105;
    uVar105 = (undefined1)(uVar1 >> 8);
    auVar96[3] = uVar105;
    auVar96[2] = uVar105;
    auVar96[0] = (undefined1)uVar1;
    auVar96[1] = auVar96[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar85 = pmaddubsw(auVar95,auVar2);
    auVar78._0_2_ = sVar32 - auVar85._0_2_;
    auVar78._2_2_ = sVar33 - auVar85._2_2_;
    auVar78._4_2_ = sVar34 - auVar85._4_2_;
    auVar78._6_2_ = sVar35 - auVar85._6_2_;
    auVar78._8_2_ = sVar36 - auVar85._8_2_;
    auVar78._10_2_ = sVar37 - auVar85._10_2_;
    auVar78._12_2_ = sVar38 - auVar85._12_2_;
    auVar78._14_2_ = sVar39 - auVar85._14_2_;
    auVar85 = pmaddubsw(auVar95,auVar3);
    auVar86._0_2_ = sVar40 - auVar85._0_2_;
    auVar86._2_2_ = sVar41 - auVar85._2_2_;
    auVar86._4_2_ = sVar42 - auVar85._4_2_;
    auVar86._6_2_ = sVar43 - auVar85._6_2_;
    auVar86._8_2_ = sVar44 - auVar85._8_2_;
    auVar86._10_2_ = sVar45 - auVar85._10_2_;
    auVar86._12_2_ = sVar46 - auVar85._12_2_;
    auVar86._14_2_ = sVar47 - auVar85._14_2_;
    auVar95 = pmaddubsw(auVar95,auVar4);
    auVar87._0_2_ = sVar48 - auVar95._0_2_;
    auVar87._2_2_ = sVar49 - auVar95._2_2_;
    auVar87._4_2_ = sVar50 - auVar95._4_2_;
    auVar87._6_2_ = sVar51 - auVar95._6_2_;
    auVar87._8_2_ = sVar52 - auVar95._8_2_;
    auVar87._10_2_ = sVar53 - auVar95._10_2_;
    auVar87._12_2_ = sVar54 - auVar95._12_2_;
    auVar87._14_2_ = sVar55 - auVar95._14_2_;
    auVar104 = pmulhuw(auVar96,auVar5);
    auVar95 = paddsw(auVar78,auVar104);
    auVar85 = paddsw(auVar86,auVar104);
    auVar104 = paddsw(auVar87,auVar104);
    auVar95 = psraw(auVar95,6);
    auVar85 = psraw(auVar85,6);
    auVar104 = psraw(auVar104,6);
    sVar9 = auVar95._0_2_;
    sVar11 = auVar95._2_2_;
    sVar14 = auVar95._4_2_;
    sVar17 = auVar95._6_2_;
    sVar20 = auVar95._8_2_;
    sVar23 = auVar95._10_2_;
    sVar26 = auVar95._12_2_;
    sVar29 = auVar95._14_2_;
    cVar7 = (0 < sVar29) * (sVar29 < 0x100) * auVar95[0xe] - (0xff < sVar29);
    sVar29 = auVar85._0_2_;
    sVar12 = auVar85._2_2_;
    sVar15 = auVar85._4_2_;
    sVar18 = auVar85._6_2_;
    sVar21 = auVar85._8_2_;
    sVar24 = auVar85._10_2_;
    sVar27 = auVar85._12_2_;
    sVar30 = auVar85._14_2_;
    sVar10 = auVar104._0_2_;
    sVar13 = auVar104._2_2_;
    sVar16 = auVar104._4_2_;
    sVar19 = auVar104._6_2_;
    sVar22 = auVar104._8_2_;
    sVar25 = auVar104._10_2_;
    sVar28 = auVar104._12_2_;
    sVar31 = auVar104._14_2_;
    cVar8 = (0 < sVar31) * (sVar31 < 0x100) * auVar104[0xe] - (0xff < sVar31);
    uVar56 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar104[0] - (0xff < sVar10),cVar8);
    auVar91._0_9_ = (unkuint9)uVar56 << 0x38;
    uVar63 = CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar104[2] - (0xff < sVar13),uVar56);
    uVar66 = CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar104[4] - (0xff < sVar16),uVar63);
    auVar67._4_7_ = 0;
    auVar67._0_4_ = uVar66;
    auVar92._0_11_ = auVar67 << 0x38;
    uVar68 = CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar104[6] - (0xff < sVar19),uVar66);
    uVar70 = CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar104[8] - (0xff < sVar22),uVar68);
    auVar71._6_7_ = 0;
    auVar71._0_6_ = uVar70;
    auVar93._0_13_ = auVar71 << 0x38;
    auVar73[6] = (0 < sVar25) * (sVar25 < 0x100) * auVar104[10] - (0xff < sVar25);
    auVar73._0_6_ = uVar70;
    uVar84 = CONCAT11((0 < sVar30) * (sVar30 < 0x100) * auVar85[0xe] - (0xff < sVar30),cVar7);
    uVar75 = CONCAT31(CONCAT21(uVar84,(0 < sVar27) * (sVar27 < 0x100) * auVar85[0xc] -
                                      (0xff < sVar27)),
                      (0 < sVar26) * (sVar26 < 0x100) * auVar95[0xc] - (0xff < sVar26));
    uVar74 = CONCAT51(CONCAT41(uVar75,(0 < sVar24) * (sVar24 < 0x100) * auVar85[10] -
                                      (0xff < sVar24)),
                      (0 < sVar23) * (sVar23 < 0x100) * auVar95[10] - (0xff < sVar23));
    Var64 = CONCAT72(CONCAT61(uVar74,(0 < sVar21) * (sVar21 < 0x100) * auVar85[8] - (0xff < sVar21))
                     ,CONCAT11((0 < sVar20) * (sVar20 < 0x100) * auVar95[8] - (0xff < sVar20),cVar7)
                    );
    Var59 = CONCAT91(CONCAT81((long)((unkuint9)Var64 >> 8),
                              (0 < sVar18) * (sVar18 < 0x100) * auVar85[6] - (0xff < sVar18)),
                     (0 < sVar17) * (sVar17 < 0x100) * auVar95[6] - (0xff < sVar17));
    auVar58._2_10_ = Var59;
    auVar58[1] = (0 < sVar15) * (sVar15 < 0x100) * auVar85[4] - (0xff < sVar15);
    auVar58[0] = (0 < sVar14) * (sVar14 < 0x100) * auVar95[4] - (0xff < sVar14);
    auVar57._2_12_ = auVar58;
    auVar57[1] = (0 < sVar12) * (sVar12 < 0x100) * auVar85[2] - (0xff < sVar12);
    auVar57[0] = (0 < sVar11) * (sVar11 < 0x100) * auVar95[2] - (0xff < sVar11);
    auVar79._0_2_ =
         CONCAT11((0 < sVar29) * (sVar29 < 0x100) * auVar85[0] - (0xff < sVar29),
                  (0 < sVar9) * (sVar9 < 0x100) * auVar95[0] - (0xff < sVar9));
    auVar79._2_14_ = auVar57;
    auVar73[7] = cVar8;
    auVar73._8_7_ = 0;
    auVar94._0_15_ = auVar73 << 0x38;
    auVar94[0xf] = 0xff;
    auVar93._14_2_ = auVar94._14_2_;
    auVar93[0xd] = 0xff;
    Var72 = CONCAT36(auVar93._13_3_,
                     CONCAT15((0 < sVar28) * (sVar28 < 0x100) * auVar104[0xc] - (0xff < sVar28),
                              uVar68));
    auVar92._12_4_ = (undefined4)((unkuint9)Var72 >> 0x28);
    auVar92[0xb] = 0xff;
    Var69 = CONCAT54(auVar92._11_5_,
                     CONCAT13((0 < sVar25) * (sVar25 < 0x100) * auVar104[10] - (0xff < sVar25),
                              uVar63));
    auVar91._10_6_ = (undefined6)((unkuint9)Var69 >> 0x18);
    auVar91[9] = 0xff;
    Var65 = CONCAT72(auVar91._9_7_,
                     CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar104[8] - (0xff < sVar22),cVar8)
                    );
    auVar90._8_8_ = (undefined8)((unkuint9)Var65 >> 8);
    auVar90._0_8_ = 0xff00000000000000;
    Var62 = CONCAT91(auVar90._7_9_,(0 < sVar19) * (sVar19 < 0x100) * auVar104[6] - (0xff < sVar19));
    auVar89._6_10_ = Var62;
    auVar89._0_6_ = 0xff0000000000;
    auVar61._1_11_ = auVar89._5_11_;
    auVar61[0] = (0 < sVar16) * (sVar16 < 0x100) * auVar104[4] - (0xff < sVar16);
    auVar88._4_12_ = auVar61;
    auVar88._0_4_ = 0xff000000;
    auVar60._1_13_ = auVar88._3_13_;
    auVar60[0] = (0 < sVar13) * (sVar13 < 0x100) * auVar104[2] - (0xff < sVar13);
    auVar80[3] = 0xff;
    auVar80[2] = (0 < sVar10) * (sVar10 < 0x100) * auVar104[0] - (0xff < sVar10);
    auVar83._0_12_ = auVar79._0_12_;
    auVar83._12_2_ = (short)Var59;
    auVar83._14_2_ = (short)Var62;
    auVar82._12_4_ = auVar83._12_4_;
    auVar82._0_10_ = auVar79._0_10_;
    auVar82._10_2_ = auVar61._0_2_;
    auVar81._10_6_ = auVar82._10_6_;
    auVar81._0_8_ = auVar79._0_8_;
    auVar81._8_2_ = auVar58._0_2_;
    auVar80._8_8_ = auVar81._8_8_;
    auVar80._6_2_ = auVar60._0_2_;
    auVar80._4_2_ = auVar57._0_2_;
    auVar80._0_2_ = auVar79._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar80;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var64 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var65 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar74;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)((unkuint9)Var69 >> 0x18)
    ;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar75;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) =
         (short)((unkuint9)Var72 >> 0x28);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar84;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar93._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar76 = width + -8;
    bVar6 = 7 < width;
    width = iVar76;
  } while (iVar76 != 0 && bVar6);
  return;
}

Assistant:

void OMITFP NV12ToARGBRow_SSSE3(const uint8_t* y_buf,
                                const uint8_t* uv_buf,
                                uint8_t* dst_argb,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READNV12
    YUVTORGB(yuvconstants)
    STOREARGB
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [uv_buf]"+r"(uv_buf),    // %[uv_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
    : "memory", "cc", YUVTORGB_REGS
      "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}